

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O0

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjectOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  bool local_21;
  bool local_13;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineConstructorsPhase,sourceContextId,
                            functionId);
  local_13 = false;
  if (!bVar1) {
    local_21 = op == NewScObject || op == NewScObjectSpread;
    local_13 = local_21;
  }
  return local_13;
}

Assistant:

bool DoProfileNewScObjectOp(OpCode op)
        {
            return
                !PHASE_OFF(InlineConstructorsPhase, m_functionWrite) &&
                (op == OpCode::NewScObject || op == OpCode::NewScObjectSpread);
        }